

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_machine.cpp
# Opt level: O2

void __thiscall
defyx::VmBase<defyx::LargePageAllocator,_true>::~VmBase
          (VmBase<defyx::LargePageAllocator,_true> *this)

{
  (this->super_defyx_vm)._vptr_defyx_vm = (_func_int **)&PTR__VmBase_00130d28;
  LargePageAllocator::freeMemory((this->super_defyx_vm).scratchpad,0x40000);
  defyx_vm::~defyx_vm(&this->super_defyx_vm);
  return;
}

Assistant:

VmBase<Allocator, softAes>::~VmBase() {
		Allocator::freeMemory(scratchpad, ScratchpadSize);
	}